

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::dispatch_node(SystemVerilogCodeGen *this,IRNode *node)

{
  initializer_list<kratos::IRNode_*> __l;
  ModuleInstantiationStmt *this_00;
  IRNodeKind IVar1;
  StatementType SVar2;
  StmtException *this_01;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  IRNodeKind kind;
  char (*format_str) [43];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str_00;
  Stmt *stmt_ptr;
  ModuleInstantiationStmt *local_118;
  ModuleInstantiationStmt **local_110;
  size_type local_108;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_100;
  string local_d8;
  string local_b8;
  ModuleInstantiationStmt *local_98;
  IRNode *node_local;
  SystemVerilogCodeGen *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_98 = (ModuleInstantiationStmt *)node;
  node_local = (IRNode *)this;
  IVar1 = IRNode::ir_node_kind(node);
  this_00 = local_98;
  if (IVar1 == StmtKind) {
    if (((this->options_).yosys_src & 1U) != 0) {
      output_yosys_src(this,(IRNode *)local_98);
    }
    SVar2 = Stmt::type(&this_00->super_Stmt);
    switch(SVar2) {
    case If:
      stmt_code(this,(IfStmt *)local_98);
      break;
    case Switch:
      stmt_code(this,(SwitchStmt *)local_98);
      break;
    case For:
      stmt_code(this,(ForStmt *)local_98);
      break;
    case Assign:
      (*this->_vptr_SystemVerilogCodeGen[1])(this,local_98);
      break;
    case Block:
      stmt_code(this,(StmtBlock *)local_98);
      break;
    case ModuleInstantiation:
      stmt_code(this,local_98);
      break;
    case InterfaceInstantiation:
      break;
    case FunctionalCall:
      stmt_code(this,(FunctionCallStmt *)local_98);
      break;
    case Return:
      stmt_code(this,(ReturnStmt *)local_98);
      break;
    case Break:
      stmt_code(this,(BreakStmt *)local_98);
      break;
    case Assert:
      stmt_code(this,(AssertBase *)local_98);
      break;
    case Comment:
      stmt_code(this,(CommentStmt *)local_98);
      break;
    case RawString:
      stmt_code(this,(RawStringStmt *)local_98);
      break;
    case Auxiliary:
      stmt_code(this,(AuxiliaryStmt *)local_98);
    }
    return;
  }
  stmt_ptr._6_1_ = 1;
  this_01 = (StmtException *)__cxa_allocate_exception(0x10);
  IVar1 = IRNode::ir_node_kind((IRNode *)local_98);
  ast_type_to_string_abi_cxx11_(&local_d8,(kratos *)(ulong)IVar1,kind);
  local_38 = &local_b8;
  local_40 = "Cannot codegen non-statement node. Got {0}";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char[43],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"Cannot codegen non-statement node. Got {0}",(v7 *)vargs,format_str,in_RCX);
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  format_str_00.size_ = (size_t)this_local;
  format_str_00.data_ = (char *)local_78.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_78.data_,format_str_00,args);
  local_118 = local_98;
  local_110 = &local_118;
  local_108 = 1;
  std::allocator<kratos::IRNode_*>::allocator((allocator<kratos::IRNode_*> *)((long)&stmt_ptr + 7));
  __l._M_len = local_108;
  __l._M_array = (iterator)local_110;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            (&local_100,__l,(allocator<kratos::IRNode_*> *)((long)&stmt_ptr + 7));
  StmtException::StmtException(this_01,&local_b8,&local_100);
  stmt_ptr._6_1_ = 0;
  __cxa_throw(this_01,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

void SystemVerilogCodeGen::dispatch_node(IRNode* node) {
    if (node->ir_node_kind() != IRNodeKind::StmtKind)
        throw StmtException(::format("Cannot codegen non-statement node. Got {0}",
                                     ast_type_to_string(node->ir_node_kind())),
                            {node});
    auto* stmt_ptr = reinterpret_cast<Stmt*>(node);

    // yosys src
    if (options_.yosys_src) output_yosys_src(node);

    // use switch for branch tables
    // also let compiler check if we have all the types covered
    switch (stmt_ptr->type()) {
        case StatementType::Assign:
            stmt_code(reinterpret_cast<AssignStmt*>(node));
            break;
        case StatementType::Block:
            stmt_code(reinterpret_cast<StmtBlock*>(node));
            break;
        case StatementType::If:
            stmt_code(reinterpret_cast<IfStmt*>(node));
            break;
        case StatementType::ModuleInstantiation:
            stmt_code(reinterpret_cast<ModuleInstantiationStmt*>(node));
            break;
        case StatementType::Switch:
            stmt_code(reinterpret_cast<SwitchStmt*>(node));
            break;
        case StatementType::FunctionalCall:
            stmt_code(reinterpret_cast<FunctionCallStmt*>(node));
            break;
        case StatementType::Return:
            stmt_code(reinterpret_cast<ReturnStmt*>(node));
            break;
        case StatementType::Assert:
            stmt_code(reinterpret_cast<AssertBase*>(node));
            break;
        case StatementType::Comment:
            stmt_code(reinterpret_cast<CommentStmt*>(node));
            break;
        case StatementType::InterfaceInstantiation:
            // do nothing
            break;
        case StatementType::RawString:
            stmt_code(reinterpret_cast<RawStringStmt*>(node));
            break;
        case StatementType::For:
            stmt_code(reinterpret_cast<ForStmt*>(node));
            break;
        case StatementType::Auxiliary:
            stmt_code(reinterpret_cast<AuxiliaryStmt*>(node));
            break;
        case StatementType::Break:
            stmt_code(reinterpret_cast<BreakStmt*>(node));
            break;
    }
}